

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_obj_to_desc(JSContext *ctx,JSPropertyDescriptor *d,JSValue desc)

{
  ushort uVar1;
  int64_t iVar2;
  int iVar3;
  uint uVar4;
  JSValueUnion JVar5;
  char *fmt;
  ulong unaff_R12;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char cVar9;
  JSValue JVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSClass *local_70;
  int64_t local_68;
  int64_t local_60;
  JSValueUnion local_58;
  JSValueUnion local_50;
  ulong local_48;
  int64_t local_40;
  JSValueUnion local_38;
  
  if ((int)desc.tag != -1) {
    JS_ThrowTypeError(ctx,"not an object");
    return -1;
  }
  iVar3 = JS_HasProperty(ctx,desc,0x3d);
  if (iVar3 == 0) {
    uVar7 = 0;
  }
  else {
    JVar10 = JS_GetPropertyInternal(ctx,desc,0x3d,desc,0);
    unaff_R12 = 0xffffffff;
    if ((int)JVar10.tag == 6) {
      return -1;
    }
    iVar3 = JS_ToBoolFree(ctx,JVar10);
    uVar7 = 0x101 - (iVar3 == 0);
  }
  iVar3 = JS_HasProperty(ctx,desc,0x3e);
  if (iVar3 != 0) {
    JVar10 = JS_GetPropertyInternal(ctx,desc,0x3e,desc,0);
    unaff_R12 = 0xffffffff;
    if ((int)JVar10.tag == 6) {
      return -1;
    }
    iVar3 = JS_ToBoolFree(ctx,JVar10);
    uVar7 = (uint)(iVar3 != 0) * 2 | uVar7 | 0x200;
  }
  iVar3 = JS_HasProperty(ctx,desc,0x3f);
  if (iVar3 != 0) {
    JVar10 = JS_GetPropertyInternal(ctx,desc,0x3f,desc,0);
    unaff_R12 = 0xffffffff;
    if ((int)JVar10.tag == 6) {
      return -1;
    }
    iVar3 = JS_ToBoolFree(ctx,JVar10);
    uVar7 = (uint)(iVar3 != 0) << 2 | uVar7 | 0x400;
  }
  iVar3 = JS_HasProperty(ctx,desc,0x40);
  JVar10 = (JSValue)(ZEXT816(3) << 0x40);
  if (iVar3 == 0) {
    JVar11 = (JSValue)(ZEXT816(3) << 0x40);
  }
  else {
    JVar11 = JS_GetPropertyInternal(ctx,desc,0x40,desc,0);
    unaff_R12 = (ulong)JVar11.u.ptr >> 0x20;
    if ((int)JVar11.tag == 6) {
      local_68 = 3;
      uVar6 = 0;
      local_70 = (JSClass *)0x0;
      local_60 = 3;
      uVar8 = 0;
      local_48 = 0;
      goto LAB_001449b3;
    }
    uVar7 = uVar7 | 0x2000;
  }
  local_40 = JVar11.tag;
  local_38 = JVar11.u;
  uVar4 = JS_HasProperty(ctx,desc,0x41);
  local_48 = (ulong)uVar4;
  if (uVar4 != 0) {
    local_70 = (JSClass *)0x41;
    JVar10 = JS_GetPropertyInternal(ctx,desc,0x41,desc,0);
    JVar5 = JVar10.u;
    local_48 = (ulong)JVar5.ptr >> 0x20;
    JVar12 = (JSValue)(ZEXT816(3) << 0x40);
    fmt = "invalid getter";
    iVar3 = (int)JVar10.tag;
    if (iVar3 == 6) {
LAB_00144b14:
      local_70 = (JSClass *)0x3;
    }
    else {
      uVar7 = uVar7 | 0x800;
      if (iVar3 == 3) goto LAB_00144b5b;
      if (iVar3 != -1) goto LAB_00144b14;
      uVar1 = *(ushort *)((long)JVar5.ptr + 6);
      if (uVar1 == 0x29) {
        cVar9 = *(char *)(*(long *)((long)JVar5.ptr + 0x30) + 0x20);
      }
      else {
        if (uVar1 == 0xd) goto LAB_00144b5b;
        local_70 = ctx->rt->class_array;
        cVar9 = local_70[uVar1].call != (JSClassCall *)0x0;
      }
      JVar12 = (JSValue)(ZEXT816(3) << 0x40);
      if (cVar9 != '\0') goto LAB_00144b5b;
    }
    goto LAB_00144b31;
  }
LAB_00144b5b:
  local_60 = JVar10.tag;
  local_50 = JVar10.u;
  iVar3 = JS_HasProperty(ctx,desc,0x42);
  if (iVar3 == 0) {
    JVar12 = (JSValue)(ZEXT816(3) << 0x40);
    local_70 = (JSClass *)0x3;
LAB_00144c13:
    local_68 = JVar12.tag;
    local_58 = JVar12.u;
    if ((uVar7 & 0x1800) == 0 || (uVar7 & 0x2200) == 0) {
      d->flags = uVar7;
      (d->value).u.ptr = (void *)((ulong)local_38.ptr & 0xffffffff | unaff_R12 << 0x20);
      (d->value).tag = local_40;
      (d->getter).u.ptr = (void *)((ulong)local_50.ptr & 0xffffffff | local_48 << 0x20);
      (d->getter).tag = local_60;
      (d->setter).u.ptr = (void *)((ulong)local_58.ptr & 0xffffffff | (long)local_70 << 0x20);
      (d->setter).tag = local_68;
      return 0;
    }
    fmt = "cannot have setter/getter and value or writable";
  }
  else {
    uVar7 = uVar7 | 0x1000;
    JVar12 = JS_GetPropertyInternal(ctx,desc,0x42,desc,0);
    JVar5 = JVar12.u;
    local_70 = (JSClass *)((ulong)JVar5.ptr >> 0x20);
    iVar3 = (int)JVar12.tag;
    if (iVar3 == 3) goto LAB_00144c13;
    fmt = "invalid setter";
    if ((iVar3 != 6) && (iVar3 == -1)) {
      uVar1 = *(ushort *)((long)JVar5.ptr + 6);
      if (uVar1 != 0xd) {
        if (uVar1 == 0x29) {
          cVar9 = *(char *)(*(long *)((long)JVar5.ptr + 0x30) + 0x20);
        }
        else {
          cVar9 = ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0;
        }
        if (cVar9 == '\0') goto LAB_00144b31;
      }
      goto LAB_00144c13;
    }
  }
LAB_00144b31:
  local_60 = JVar10.tag;
  local_50 = JVar10.u;
  local_68 = JVar12.tag;
  local_58 = JVar12.u;
  JS_ThrowTypeError(ctx,fmt);
  local_48 = local_48 << 0x20;
  uVar8 = (ulong)local_50.ptr & 0xffffffff;
  local_70 = (JSClass *)((long)local_70 << 0x20);
  uVar6 = (ulong)local_58.ptr & 0xffffffff;
LAB_001449b3:
  local_40 = JVar11.tag;
  iVar2 = local_40;
  local_38 = JVar11.u;
  local_40._0_4_ = (uint)JVar11.tag;
  if (0xfffffff4 < (uint)local_40) {
    JVar10.u.ptr = (void *)((ulong)local_38.ptr & 0xffffffff | unaff_R12 << 0x20);
    iVar3 = *JVar10.u.ptr;
    *(int *)JVar10.u.ptr = iVar3 + -1;
    if (iVar3 < 2) {
      JVar10.tag = iVar2;
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
  }
  if (0xfffffff4 < (uint)local_60) {
    JVar5.ptr = (void *)(local_48 | uVar8);
    iVar3 = *JVar5.ptr;
    *(int *)JVar5.ptr = iVar3 + -1;
    if (iVar3 < 2) {
      JVar11.tag = local_60;
      JVar11.u.ptr = JVar5.ptr;
      __JS_FreeValueRT(ctx->rt,JVar11);
    }
  }
  if (0xfffffff4 < (uint)local_68) {
    JVar5.ptr = (void *)((ulong)local_70 | uVar6);
    iVar3 = *JVar5.ptr;
    *(int *)JVar5.ptr = iVar3 + -1;
    if (iVar3 < 2) {
      JVar12.tag = local_68;
      JVar12.u.ptr = JVar5.ptr;
      __JS_FreeValueRT(ctx->rt,JVar12);
    }
  }
  return -1;
}

Assistant:

static int js_obj_to_desc(JSContext *ctx, JSPropertyDescriptor *d,
                          JSValueConst desc)
{
    JSValue val, getter, setter;
    int flags;

    if (!JS_IsObject(desc)) {
        JS_ThrowTypeErrorNotAnObject(ctx);
        return -1;
    }
    flags = 0;
    val = JS_UNDEFINED;
    getter = JS_UNDEFINED;
    setter = JS_UNDEFINED;
    if (JS_HasProperty(ctx, desc, JS_ATOM_configurable)) {
        JSValue prop = JS_GetProperty(ctx, desc, JS_ATOM_configurable);
        if (JS_IsException(prop))
            goto fail;
        flags |= JS_PROP_HAS_CONFIGURABLE;
        if (JS_ToBoolFree(ctx, prop))
            flags |= JS_PROP_CONFIGURABLE;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_writable)) {
        JSValue prop = JS_GetProperty(ctx, desc, JS_ATOM_writable);
        if (JS_IsException(prop))
            goto fail;
        flags |= JS_PROP_HAS_WRITABLE;
        if (JS_ToBoolFree(ctx, prop))
            flags |= JS_PROP_WRITABLE;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_enumerable)) {
        JSValue prop = JS_GetProperty(ctx, desc, JS_ATOM_enumerable);
        if (JS_IsException(prop))
            goto fail;
        flags |= JS_PROP_HAS_ENUMERABLE;
        if (JS_ToBoolFree(ctx, prop))
            flags |= JS_PROP_ENUMERABLE;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_value)) {
        flags |= JS_PROP_HAS_VALUE;
        val = JS_GetProperty(ctx, desc, JS_ATOM_value);
        if (JS_IsException(val))
            goto fail;
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_get)) {
        flags |= JS_PROP_HAS_GET;
        getter = JS_GetProperty(ctx, desc, JS_ATOM_get);
        if (JS_IsException(getter) ||
            !(JS_IsUndefined(getter) || JS_IsFunction(ctx, getter))) {
            JS_ThrowTypeError(ctx, "invalid getter");
            goto fail;
        }
    }
    if (JS_HasProperty(ctx, desc, JS_ATOM_set)) {
        flags |= JS_PROP_HAS_SET;
        setter = JS_GetProperty(ctx, desc, JS_ATOM_set);
        if (JS_IsException(setter) ||
            !(JS_IsUndefined(setter) || JS_IsFunction(ctx, setter))) {
            JS_ThrowTypeError(ctx, "invalid setter");
            goto fail;
        }
    }
    if ((flags & (JS_PROP_HAS_SET | JS_PROP_HAS_GET)) &&
        (flags & (JS_PROP_HAS_VALUE | JS_PROP_HAS_WRITABLE))) {
        JS_ThrowTypeError(ctx, "cannot have setter/getter and value or writable");
        goto fail;
    }
    d->flags = flags;
    d->value = val;
    d->getter = getter;
    d->setter = setter;
    return 0;
 fail:
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, getter);
    JS_FreeValue(ctx, setter);
    return -1;
}